

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XPathMatcher::startElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,
          ValidationContext *validationContext)

{
  XercesNodeTest *pXVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ValueStackOf<unsigned_long> *pVVar5;
  XercesLocationPath *this_00;
  XercesStep *pXVar6;
  XMLSize_t *pXVar7;
  XMLAttr *pXVar8;
  SchemaAttDef *pSVar9;
  undefined4 extraout_var;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  ulong uVar10;
  byte bVar11;
  ulong index;
  XMLCh *toSearch;
  XPathMatcher *pXVar12;
  XMLSize_t XVar13;
  XMLSize_t XVar14;
  DatatypeValidator *pDVar15;
  ulong getAt;
  XMLSize_t startStep;
  QName elemQName;
  ArrayJanitor<char16_t> janPrefix;
  undefined4 extraout_var_00;
  
  getAt = 0;
  do {
    if (this->fLocationPathSize <= getAt) {
      return;
    }
    startStep = this->fCurrentStep[getAt];
    pVVar5 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                       (&this->fStepIndexes->
                         super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,getAt);
    ValueVectorOf<unsigned_long>::addElement(&pVVar5->fVector,&startStep);
    bVar11 = this->fMatched[getAt] & 5;
    XVar14 = this->fNoMatchDepth[getAt];
    if (bVar11 == 1 || XVar14 != 0) {
      this->fNoMatchDepth[getAt] = XVar14 + 1;
      goto LAB_0030635c;
    }
    if (bVar11 == 5) {
      this->fMatched[getAt] = '\r';
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                        (&this->fLocationPaths->
                          super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,getAt);
    if (this_00->fSteps == (RefVectorOf<xercesc_4_0::XercesStep> *)0x0) {
      XVar14 = 0;
    }
    else {
      XVar14 = (this_00->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>).fCurCount;
    }
    pXVar7 = this->fCurrentStep;
    index = pXVar7[getAt];
    while (index < XVar14) {
      pXVar6 = XercesLocationPath::getStep(this_00,index);
      pXVar7 = this->fCurrentStep;
      index = pXVar7[getAt];
      if (pXVar6->fAxisType != 3) break;
      index = index + 1;
      pXVar7[getAt] = index;
    }
    XVar13 = index;
    if (index == XVar14) {
LAB_0030631c:
      this->fMatched[getAt] = '\x01';
      goto LAB_0030635c;
    }
    while (XVar13 < XVar14) {
      pXVar6 = XercesLocationPath::getStep(this_00,XVar13);
      pXVar7 = this->fCurrentStep;
      XVar13 = pXVar7[getAt];
      if (pXVar6->fAxisType != 4) break;
      XVar13 = XVar13 + 1;
      pXVar7[getAt] = XVar13;
    }
    if (XVar13 == XVar14) {
LAB_00306354:
      this->fNoMatchDepth[getAt] = this->fNoMatchDepth[getAt] + 1;
    }
    else {
      if ((index < XVar13) || (XVar13 == startStep)) {
        pXVar6 = XercesLocationPath::getStep(this_00,XVar13);
        pXVar7 = this->fCurrentStep;
        if (pXVar6->fAxisType == 1) {
          pXVar6 = XercesLocationPath::getStep(this_00,pXVar7[getAt]);
          pXVar1 = pXVar6->fNodeTest;
          pXVar12 = (XPathMatcher *)&elemQName;
          QName::QName((QName *)pXVar12,elemPrefix,elemDecl->fElementName->fLocalPart,urlId,
                       this->fMemoryManager);
          bVar2 = matches(pXVar12,pXVar1,&elemQName);
          pXVar7 = this->fCurrentStep;
          if (bVar2) {
            pXVar7[getAt] = pXVar7[getAt] + 1;
          }
          else if (index < pXVar7[getAt]) {
            pXVar7[getAt] = index;
          }
          else {
            this->fNoMatchDepth[getAt] = this->fNoMatchDepth[getAt] + 1;
          }
          QName::~QName(&elemQName);
          if (!bVar2) goto LAB_0030635c;
          pXVar7 = this->fCurrentStep;
        }
      }
      uVar10 = pXVar7[getAt];
      if (uVar10 == XVar14) {
        if (XVar13 <= index) goto LAB_0030631c;
        pXVar7[getAt] = index;
        this->fMatched[getAt] = '\x05';
      }
      else if (uVar10 < XVar14) {
        pXVar6 = XercesLocationPath::getStep(this_00,uVar10);
        if (pXVar6->fAxisType == 2) {
          if (attrCount != 0) {
            pXVar6 = XercesLocationPath::getStep(this_00,this->fCurrentStep[getAt]);
            pXVar1 = pXVar6->fNodeTest;
            XVar13 = 0;
            do {
              if (attrCount == XVar13) goto LAB_0030665e;
              pXVar12 = (XPathMatcher *)attrList;
              pXVar8 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                 (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar13);
              bVar2 = matches(pXVar12,pXVar1,pXVar8->fAttName);
              XVar13 = XVar13 + 1;
            } while (!bVar2);
            uVar10 = this->fCurrentStep[getAt] + 1;
            this->fCurrentStep[getAt] = uVar10;
            if (uVar10 == XVar14) {
              this->fMatched[getAt] = '\x03';
              pSVar9 = SchemaElementDecl::getAttDef
                                 ((SchemaElementDecl *)elemDecl,pXVar8->fAttName->fLocalPart,
                                  pXVar8->fAttName->fURIId);
              if (pSVar9 == (SchemaAttDef *)0x0) {
                toSearch = pXVar8->fValue;
LAB_00306649:
                pDVar15 = (DatatypeValidator *)0x0;
              }
              else {
                pDVar15 = pSVar9->fDatatypeValidator;
                toSearch = pXVar8->fValue;
                if (pDVar15 == (DatatypeValidator *)0x0) goto LAB_00306649;
                if (pDVar15->fType == QName) {
                  iVar3 = XMLString::indexOf(toSearch,L':');
                  if (iVar3 != -1) {
                    elemQName._32_8_ = this->fMemoryManager;
                    elemQName.super_XSerializable._vptr_XSerializable = (_func_int **)0x0;
                    elemQName.fPrefixBufSz = 0x3ff;
                    elemQName.fLocalPartBufSz = 0;
                    elemQName.fRawNameBufSz._0_1_ = 0;
                    elemQName.fPrefix = (XMLCh *)0x0;
                    elemQName.fLocalPart = (XMLCh *)0x0;
                    iVar4 = (*((MemoryManager *)elemQName._32_8_)->_vptr_MemoryManager[3])
                                      (elemQName._32_8_,0x800);
                    elemQName.fLocalPart = (XMLCh *)CONCAT44(extraout_var,iVar4);
                    *elemQName.fLocalPart = L'\0';
                    XMLBuffer::append((XMLBuffer *)&elemQName,L'{');
                    XVar14 = (XMLSize_t)iVar3;
                    if (validationContext != (ValidationContext *)0x0) {
                      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                        (this->fMemoryManager,XVar14 * 2 + 2);
                      toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
                      ArrayJanitor<char16_t>::ArrayJanitor(&janPrefix,toDelete,this->fMemoryManager)
                      ;
                      XMLString::subString(toDelete,toSearch,0,XVar14,this->fMemoryManager);
                      iVar3 = (*validationContext->_vptr_ValidationContext[0xf])
                                        (validationContext,toDelete);
                      XMLBuffer::append((XMLBuffer *)&elemQName,
                                        (XMLCh *)CONCAT44(extraout_var_01,iVar3));
                      ArrayJanitor<char16_t>::~ArrayJanitor(&janPrefix);
                    }
                    XMLBuffer::append((XMLBuffer *)&elemQName,L'}');
                    XMLBuffer::append((XMLBuffer *)&elemQName,toSearch + XVar14 + 1);
                    elemQName.fLocalPart[(long)elemQName.super_XSerializable._vptr_XSerializable] =
                         L'\0';
                    (*this->_vptr_XPathMatcher[6])(this,elemQName.fLocalPart,pDVar15,0);
                    XMLBuffer::~XMLBuffer((XMLBuffer *)&elemQName);
                    goto LAB_0030665e;
                  }
                }
              }
              (*this->_vptr_XPathMatcher[6])(this,toSearch,pDVar15,0);
            }
          }
LAB_0030665e:
          if ((this->fMatched[getAt] & 1) == 0) {
            if (this->fCurrentStep[getAt] <= index) goto LAB_00306354;
            this->fCurrentStep[getAt] = index;
          }
        }
      }
    }
LAB_0030635c:
    getAt = getAt + 1;
  } while( true );
}

Assistant:

void XPathMatcher::startElement(const XMLElementDecl& elemDecl,
                                const unsigned int urlId,
                                const XMLCh* const elemPrefix,
								const RefVectorOf<XMLAttr>& attrList,
                                const XMLSize_t attrCount,
                                ValidationContext* validationContext /*=0*/) {

    for (XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // push context
        XMLSize_t startStep = fCurrentStep[i];
        fStepIndexes->elementAt(i)->push(startStep);

        // try next xpath, if not matching
        if ((fMatched[i] & XP_MATCHED_D) == XP_MATCHED || fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]++;
            continue;
        }

        if((fMatched[i] & XP_MATCHED_D) == XP_MATCHED_D) {
            fMatched[i] = XP_MATCHED_DP;
        }

        // consume self::node() steps
        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_SELF) {
            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            fMatched[i] = XP_MATCHED;
            continue;
        }

        // now if the current step is a descendant step, we let the next
        // step do its thing; if it fails, we reset ourselves
        // to look at this step for next time we're called.
        // so first consume all descendants:
        XMLSize_t descendantStep = fCurrentStep[i];

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_DESCENDANT) {
            fCurrentStep[i]++;
        }

        bool sawDescendant = fCurrentStep[i] > descendantStep;
        if (fCurrentStep[i] == stepSize) {

            fNoMatchDepth[i]++;
            continue;
        }

        // match child::... step, if haven't consumed any self::node()
        if ((fCurrentStep[i] == startStep || fCurrentStep[i] > descendantStep) &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_CHILD) {

            XercesStep* step = locPath->getStep(fCurrentStep[i]);
            XercesNodeTest* nodeTest = step->getNodeTest();

            QName elemQName(elemPrefix, elemDecl.getElementName()->getLocalPart(), urlId, fMemoryManager);
            if (!matches(nodeTest, &elemQName)) {

                if(fCurrentStep[i] > descendantStep) {
                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
                continue;
            }

            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            if (sawDescendant) {

                fCurrentStep[i] = descendantStep;
                fMatched[i] = XP_MATCHED_D;
            }
            else {
                fMatched[i] = XP_MATCHED;
            }

            continue;
        }

        // match attribute::... step
        if (fCurrentStep[i] < stepSize &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {

            if (attrCount) {

                XercesNodeTest* nodeTest = locPath->getStep(fCurrentStep[i])->getNodeTest();

                for (XMLSize_t attrIndex = 0; attrIndex < attrCount; attrIndex++) {

                    const XMLAttr* curDef = attrList.elementAt(attrIndex);

                    if (matches(nodeTest, curDef->getAttName())) {

                        fCurrentStep[i]++;

                        if (fCurrentStep[i] == stepSize) {

                            fMatched[i] = XP_MATCHED_A;

                            SchemaAttDef* attDef = ((SchemaElementDecl&) elemDecl).getAttDef(curDef->getName(), curDef->getURIId());
                            DatatypeValidator* dv = (attDef) ? attDef->getDatatypeValidator() : 0;
                            const XMLCh* value = curDef->getValue();
                            // store QName using their Clark name
                            if(dv && dv->getType()==DatatypeValidator::QName)
                            {
                                int index=XMLString::indexOf(value, chColon);
                                if(index==-1)
                                    matched(value, dv, false);
                                else
                                {
                                    XMLBuffer buff(1023, fMemoryManager);
                                    buff.append(chOpenCurly);
                                    if(validationContext)
                                    {
                                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                                        XMLString::subString(prefix, value, 0, (XMLSize_t)index, fMemoryManager);
                                        buff.append(validationContext->getURIForPrefix(prefix));
                                    }
                                    buff.append(chCloseCurly);
                                    buff.append(value+index+1);
                                    matched(buff.getRawBuffer(), dv, false);
                                }
                            }
                            else
                                matched(value, dv, false);
                        }
                        break;
                    }
                }
            }

            if ((fMatched[i] & XP_MATCHED) != XP_MATCHED) {

                if(fCurrentStep[i] > descendantStep) {

                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
            }
        }
    }
}